

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::RepeatedField<bool>::Resize(RepeatedField<bool> *this,int new_size,bool *value)

{
  LogMessage *other;
  bool *pbVar1;
  bool *pbVar2;
  LogMessage local_68;
  LogFinisher local_29;
  
  if (new_size < 0) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/repeated_field.h"
               ,0x506);
    other = internal::LogMessage::operator<<(&local_68,"CHECK failed: (new_size) >= (0): ");
    internal::LogFinisher::operator=(&local_29,other);
    internal::LogMessage::~LogMessage(&local_68);
  }
  if (this->current_size_ < new_size) {
    Reserve(this,new_size);
    pbVar1 = elements(this);
    pbVar1 = pbVar1 + this->current_size_;
    pbVar2 = elements(this);
    if (pbVar1 != pbVar2 + new_size) {
      memset(pbVar1,(uint)*value,(long)(pbVar2 + new_size) - (long)pbVar1);
    }
  }
  this->current_size_ = new_size;
  return;
}

Assistant:

inline void RepeatedField<Element>::Resize(int new_size, const Element& value) {
  GOOGLE_DCHECK_GE(new_size, 0);
  if (new_size > current_size_) {
    Reserve(new_size);
    std::fill(&elements()[current_size_], &elements()[new_size], value);
  }
  current_size_ = new_size;
}